

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O2

size_type ot::commissioner::EndsWithAtPos(string *testString,string *subString)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  uVar1 = testString->_M_string_length;
  sVar3 = subString->_M_string_length;
  if (uVar1 < subString->_M_string_length) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)testString);
    bVar2 = std::operator!=(&bStack_48,subString);
    std::__cxx11::string::~string((string *)&bStack_48);
    sVar3 = uVar1 - sVar3;
    if (bVar2) {
      sVar3 = 0xffffffffffffffff;
    }
  }
  return sVar3;
}

Assistant:

static std::string::size_type EndsWithAtPos(const std::string &testString, const std::string &subString)
{
    auto result = std::string::npos;
    ;

    if (testString.length() >= subString.length())
    {
        result = testString.length() - subString.length();
        if (testString.substr(result) != subString)
        {
            result = std::string::npos;
        }
    }
    return result;
}